

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall
amrex::FabArrayBase::flushTileArray(FabArrayBase *this,IntVect *tileSize,bool no_assertion)

{
  iterator __position;
  _Rb_tree_node_base *p_Var1;
  iterator __position_00;
  _Base_ptr p_Var2;
  int iVar3;
  long lVar4;
  key_type local_40;
  
  __position = std::
               _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
               ::find((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
                       *)m_TheTileArrayCache,&this->m_bdkey);
  if (__position._M_node != (_Base_ptr)(m_TheTileArrayCache + 8)) {
    if (((tileSize->vect[0] == 0) && (tileSize->vect[1] == 0)) && (tileSize->vect[2] == 0)) {
      iVar3 = m_TAC_stats;
      p_Var2 = DAT_0071ae58;
      lVar4 = DAT_0071ae70;
      for (p_Var1 = __position._M_node[2]._M_parent;
          p_Var1 != (_Rb_tree_node_base *)&__position._M_node[1]._M_right;
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
        iVar3 = iVar3 + -1;
        lVar4 = lVar4 + 1;
        if ((long)p_Var2 <= (long)p_Var1[1]._M_right) {
          p_Var2 = p_Var1[1]._M_right;
        }
        m_TAC_stats = iVar3;
        DAT_0071ae58 = p_Var2;
        DAT_0071ae70 = lVar4;
      }
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
                      *)m_TheTileArrayCache,(const_iterator)__position._M_node);
      return;
    }
    local_40.second = BATransformer::coarsen_ratio(&(this->boxarray).m_bat);
    local_40.first.vect[2] = tileSize->vect[2];
    local_40.first.vect._0_8_ = *(undefined8 *)tileSize->vect;
    __position_00 =
         std::
         _Rb_tree<std::pair<amrex::IntVect,_amrex::IntVect>,_std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>,_std::_Select1st<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
         ::find((_Rb_tree<std::pair<amrex::IntVect,_amrex::IntVect>,_std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>,_std::_Select1st<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                 *)&__position._M_node[1]._M_left,&local_40);
    if (__position_00._M_node != (_Base_ptr)&__position._M_node[1]._M_right) {
      m_TAC_stats = m_TAC_stats + -1;
      DAT_0071ae70 = DAT_0071ae70 + 1;
      p_Var2 = __position_00._M_node[1]._M_right;
      if ((long)__position_00._M_node[1]._M_right < (long)DAT_0071ae58) {
        p_Var2 = DAT_0071ae58;
      }
      DAT_0071ae58 = p_Var2;
      std::
      _Rb_tree<std::pair<amrex::IntVect,_amrex::IntVect>,_std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>,_std::_Select1st<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
      ::_M_erase_aux((_Rb_tree<std::pair<amrex::IntVect,_amrex::IntVect>,_std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>,_std::_Select1st<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                      *)&__position._M_node[1]._M_left,(const_iterator)__position_00._M_node);
    }
  }
  return;
}

Assistant:

void
FabArrayBase::flushTileArray (const IntVect& tileSize, bool no_assertion) const
{
    amrex::ignore_unused(no_assertion);
    BL_ASSERT(no_assertion || getBDKey() == m_bdkey);

    TACache& tao = m_TheTileArrayCache;
    TACache::iterator tao_it = tao.find(m_bdkey);
    if(tao_it != tao.end())
    {
        if (tileSize == IntVect::TheZeroVector())
        {
            for (TAMap::const_iterator tai_it = tao_it->second.begin();
                 tai_it != tao_it->second.end(); ++tai_it)
            {
#ifdef AMREX_MEM_PROFILING
                m_TAC_stats.bytes -= tai_it->second.bytes();
#endif
                m_TAC_stats.recordErase(tai_it->second.nuse);
            }
            tao.erase(tao_it);
        }
        else
        {
            TAMap& tai = tao_it->second;
            const IntVect& crse_ratio = boxArray().crseRatio();
            TAMap::iterator tai_it = tai.find(std::pair<IntVect,IntVect>(tileSize,crse_ratio));
            if (tai_it != tai.end()) {
#ifdef AMREX_MEM_PROFILING
                m_TAC_stats.bytes -= tai_it->second.bytes();
#endif
                m_TAC_stats.recordErase(tai_it->second.nuse);
                tai.erase(tai_it);
            }
        }
    }
}